

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O1

boolean intended_cdt(int cdt)

{
  if ((((((cdt != 0) || (flags.pacifist == '\0')) && ((cdt != 2 || (flags.atheist == '\0')))) &&
       ((cdt != 3 || (flags.nudist == '\0')))) && ((cdt != 4 || (flags.blindfolded == '\0')))) &&
     ((((cdt != 5 || (flags.ascet == '\0')) && ((cdt != 6 || (flags.vegan == '\0')))) &&
      ((cdt != 7 || (flags.vegetarian == '\0')))))) {
    return flags.illiterate != '\0' && cdt == 8;
  }
  return '\x01';
}

Assistant:

boolean intended_cdt(int cdt)
{
	if (cdt == CONDUCT_PACIFISM && flags.pacifist) return TRUE;
	if (cdt == CONDUCT_ATHEISM && flags.atheist) return TRUE;
	if (cdt == CONDUCT_NUDISM && flags.nudist) return TRUE;
	if (cdt == CONDUCT_BLINDFOLDED && flags.blindfolded) return TRUE;
	if (cdt == CONDUCT_FOODLESS && flags.ascet) return TRUE;
	if (cdt == CONDUCT_VEGAN && flags.vegan) return TRUE;
	if (cdt == CONDUCT_VEGETARIAN && flags.vegetarian) return TRUE;
	if (cdt == CONDUCT_ILLITERACY && flags.illiterate) return TRUE;

	return FALSE;
}